

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

String __thiscall testing::internal::CapturedStream::GetCapturedString(CapturedStream *this)

{
  size_t extraout_RDX;
  int *in_RSI;
  FILE *in_RDI;
  String SVar1;
  FILE *file;
  String *content;
  FILE *path;
  FILE *file_00;
  
  path = in_RDI;
  file_00 = in_RDI;
  if (in_RSI[1] != -1) {
    fflush((FILE *)0x0);
    dup2(in_RSI[1],*in_RSI);
    close(in_RSI[1]);
    in_RSI[1] = -1;
  }
  std::__cxx11::string::c_str();
  posix::FOpen((char *)path,(char *)in_RDI);
  ReadEntireFile(file_00);
  posix::FClose((FILE *)0x203faa);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)path;
  return SVar1;
}

Assistant:

String GetCapturedString() {
    if (uncaptured_fd_ != -1) {
      // Restores the original stream.
      fflush(NULL);
      dup2(uncaptured_fd_, fd_);
      close(uncaptured_fd_);
      uncaptured_fd_ = -1;
    }

    FILE* const file = posix::FOpen(filename_.c_str(), "r");
    const String content = ReadEntireFile(file);
    posix::FClose(file);
    return content;
  }